

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

bool __thiscall DepsLog::OpenForWriteIfNeeded(DepsLog *this)

{
  int iVar1;
  ulong uVar2;
  char *__filename;
  FILE *pFVar3;
  long lVar4;
  size_t sVar5;
  DepsLog *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    pFVar3 = fopen(__filename,"ab");
    this->file_ = (FILE *)pFVar3;
    if (this->file_ == (FILE *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      iVar1 = setvbuf((FILE *)this->file_,(char *)0x0,0,0x80000);
      if (iVar1 == 0) {
        iVar1 = fileno((FILE *)this->file_);
        SetCloseOnExec(iVar1);
        fseek((FILE *)this->file_,0,2);
        lVar4 = ftell((FILE *)this->file_);
        if (lVar4 == 0) {
          sVar5 = fwrite("# ninjadeps\n",0xc,1,(FILE *)this->file_);
          if (sVar5 == 0) {
            return false;
          }
          sVar5 = fwrite(&kCurrentVersion,4,1,(FILE *)this->file_);
          if (sVar5 == 0) {
            return false;
          }
        }
        iVar1 = fflush((FILE *)this->file_);
        if (iVar1 == 0) {
          std::__cxx11::string::clear();
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DepsLog::OpenForWriteIfNeeded() {
  if (file_path_.empty()) {
    return true;
  }
  file_ = fopen(file_path_.c_str(), "ab");
  if (!file_) {
    return false;
  }
  // Set the buffer size to this and flush the file buffer after every record
  // to make sure records aren't written partially.
  if (setvbuf(file_, NULL, _IOFBF, kMaxRecordSize + 1) != 0) {
    return false;
  }
  SetCloseOnExec(fileno(file_));

  // Opening a file in append mode doesn't set the file pointer to the file's
  // end on Windows. Do that explicitly.
  fseek(file_, 0, SEEK_END);

  if (ftell(file_) == 0) {
    if (fwrite(kFileSignature, sizeof(kFileSignature) - 1, 1, file_) < 1) {
      return false;
    }
    if (fwrite(&kCurrentVersion, 4, 1, file_) < 1) {
      return false;
    }
  }
  if (fflush(file_) != 0) {
    return false;
  }
  file_path_.clear();
  return true;
}